

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httppost.cpp
# Opt level: O2

string * __thiscall
hbm::HttpPost::execute(string *__return_storage_ptr__,HttpPost *this,string *request)

{
  int iVar1;
  ostream *poVar2;
  ssize_t sVar3;
  long lVar4;
  socklen_t in_ECX;
  allocator aStack_405f1;
  string response;
  stringstream message;
  ostream aoStack_405c0 [376];
  char recvBuffer [1024];
  SocketNonblocking socket;
  
  std::__cxx11::stringstream::stringstream((stringstream *)&message);
  poVar2 = std::operator<<(aoStack_405c0,"POST ");
  poVar2 = std::operator<<(poVar2,(string *)&this->m_httpPath);
  std::operator<<(poVar2," HTTP/1.0\r\n");
  poVar2 = std::operator<<(aoStack_405c0,"Host: ");
  poVar2 = std::operator<<(poVar2,(string *)this);
  std::operator<<(poVar2,"\r\n");
  std::operator<<(aoStack_405c0,"Accept: */*\r\n");
  poVar2 = std::operator<<(aoStack_405c0,"Content-Type: application/json; charset=utf-8");
  std::operator<<(poVar2,"\r\n");
  poVar2 = std::operator<<(aoStack_405c0,"Content-Length: ");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::operator<<(poVar2,"\r\n");
  std::operator<<(aoStack_405c0,"\r\n");
  std::operator<<(aoStack_405c0,(string *)request);
  SocketNonblocking::SocketNonblocking(&socket);
  SocketNonblocking::connect(&socket,(int)this,(sockaddr *)&this->m_port,in_ECX);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringbuf::str();
  sVar3 = SocketNonblocking::sendBlock
                    (&socket,(void *)recvBuffer._0_8_,response._M_string_length,false);
  std::__cxx11::string::~string((string *)&response);
  std::__cxx11::string::~string((string *)recvBuffer);
  if (sVar3 < 1) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,"",(allocator *)recvBuffer);
  }
  else {
    sVar3 = SocketNonblocking::receiveComplete(&socket,recvBuffer,0x400);
    recvBuffer[0x3ff] = '\0';
    poVar2 = std::operator<<((ostream *)&std::cout,recvBuffer);
    std::endl<char,std::char_traits<char>>(poVar2);
    if (sVar3 < 1) {
      std::__cxx11::string::string((string *)__return_storage_ptr__,"",(allocator *)&response);
    }
    else {
      if (execute(std::__cxx11::string_const&)::NEEDLE_abi_cxx11_ == '\0') {
        iVar1 = __cxa_guard_acquire(&execute(std::__cxx11::string_const&)::NEEDLE_abi_cxx11_);
        if (iVar1 != 0) {
          std::__cxx11::string::string
                    ((string *)&execute(std::__cxx11::string_const&)::NEEDLE_abi_cxx11_,"\r\n\r\n",
                     (allocator *)&response);
          __cxa_atexit(std::__cxx11::string::~string,
                       &execute(std::__cxx11::string_const&)::NEEDLE_abi_cxx11_,&__dso_handle);
          __cxa_guard_release(&execute(std::__cxx11::string_const&)::NEEDLE_abi_cxx11_);
        }
      }
      response._M_dataplus._M_p = (pointer)&response.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&response,recvBuffer,recvBuffer + sVar3);
      lVar4 = std::__cxx11::string::find((string *)&response,0x1795a8);
      if (lVar4 == -1) {
        std::__cxx11::string::string((string *)__return_storage_ptr__,"",&aStack_405f1);
      }
      else {
        std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)&response);
      }
      std::__cxx11::string::~string((string *)&response);
    }
  }
  SocketNonblocking::~SocketNonblocking(&socket);
  std::__cxx11::stringstream::~stringstream((stringstream *)&message);
  return __return_storage_ptr__;
}

Assistant:

std::string HttpPost::execute(const std::string& request)
	{
		std::stringstream message;
		message << "POST " << m_httpPath << " HTTP/1.0\r\n";
		message << "Host: " << m_address << "\r\n";
		message << "Accept: */*\r\n";
		message << "Content-Type: application/json; charset=utf-8" << "\r\n";
		message << "Content-Length: " << request.length() << "\r\n";
		message << "\r\n";
		message << request;

		SocketNonblocking socket;
		socket.connect(m_address, m_port);

		if(socket.sendBlock(message.str().c_str(), message.str().length(), 0)<=0) {
			return "";
		}

		char recvBuffer[1024];
		// important HTTP 1.0 will return the response and close the socket afterwards. This does look like a short read.
		ssize_t retVal = socket.receiveComplete(recvBuffer, sizeof(recvBuffer));
		// ensure termination!
		recvBuffer[sizeof(recvBuffer)-1] = '\0';

		std::cout << recvBuffer << std::endl;
		if(retVal>0) {
			static const std::string NEEDLE("\r\n\r\n");

			std::string response(recvBuffer, retVal);
			// body with response is to be found after the first empty line
			size_t position = response.find(NEEDLE);
			if(position == std::string::npos) {
				return "";
			} else {
				return response.substr(position+NEEDLE.length());
			}
		}
		return "";
	}